

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_tests.cpp
# Opt level: O2

void __thiscall skiwi::anon_unknown_23::compile_fixture::build_apply(compile_fixture *this)

{
  char cVar1;
  fun_ptr f;
  uint64_t size;
  asmcode code;
  logic_error e;
  _func_unsigned_long_void_ptr_varargs *local_c8;
  ulong local_c0;
  asmcode local_b8 [48];
  first_pass_data local_88;
  
  assembler::asmcode::asmcode(local_b8);
  cVar1 = skiwi::load_apply((shared_ptr *)&this->env,&this->rd,&this->md,&this->ctxt,local_b8,
                            (map *)&this->pm,&this->ops);
  if (cVar1 == '\0') {
    std::operator<<((ostream *)&std::cout,"Cannot load apply\n");
  }
  else {
    local_88.label_to_address._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_88.label_to_address._M_t._M_impl.super__Rb_tree_header._M_header;
    local_88.label_to_address._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_88.label_to_address._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    local_88.size = 0;
    local_88.data_size = 0;
    local_88.label_to_address._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_88.external_to_address._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_88.external_to_address._M_t._M_impl.super__Rb_tree_header._M_header;
    local_88.external_to_address._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_88.external_to_address._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    local_88.external_to_address._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_88.label_to_address._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_88.label_to_address._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_88.external_to_address._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_88.external_to_address._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_c8 = (_func_unsigned_long_void_ptr_varargs *)
               assembler::assemble(&local_c0,&local_88,local_b8);
    (*local_c8)(&this->ctxt);
    std::
    vector<std::pair<unsigned_long(*)(void*,...),unsigned_long>,std::allocator<std::pair<unsigned_long(*)(void*,...),unsigned_long>>>
    ::emplace_back<unsigned_long(*&)(void*,___),unsigned_long&>
              ((vector<std::pair<unsigned_long(*)(void*,___),unsigned_long>,std::allocator<std::pair<unsigned_long(*)(void*,___),unsigned_long>>>
                *)&this->compiled_functions,&local_c8,&local_c0);
    assembler::first_pass_data::~first_pass_data(&local_88);
  }
  assembler::asmcode::~asmcode(local_b8);
  return;
}

Assistant:

void build_apply()
      {
      asmcode code;
      try
        {
        if (load_apply(env, rd, md, ctxt, code, pm, ops))
          {
          digest_asmcode(code);
          first_pass_data d;
          uint64_t size;
          fun_ptr f = (fun_ptr)assemble(size, d, code);
          f(&ctxt);
          compiled_functions.emplace_back(f, size);
          }
        else
          std::cout << "Cannot load apply\n";
        }
      catch (std::logic_error e)
        {
        std::cout << e.what() << " while compiling apply library\n\n";
        }
      }